

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-think.c
# Opt level: O3

void borg_oops(char *what)

{
  char *what_00;
  
  borg_active = false;
  what_00 = format("# Aborting (%s).",what);
  borg_note(what_00);
  borg_flush();
  return;
}

Assistant:

void borg_oops(const char *what)
{
    /* Stop processing */
    borg_active = false;

    /* Give a warning */
    borg_note(format("# Aborting (%s).", what));

    /* Forget borg keys */
    borg_flush();
}